

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>,_QString_&>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  long lVar1;
  QChar *pQVar2;
  CutResult CVar3;
  char16_t *pcVar4;
  char16_t *__src;
  long lVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (p->a).a.a.d.size;
  if (lVar1 != 0) {
    pcVar4 = (p->a).a.a.d.ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar4,lVar1 * 2);
  }
  pQVar2 = *out;
  *out = pQVar2 + lVar1;
  lVar5 = (long)(p->a).a.b.m_length;
  if (lVar5 != 0) {
    pcVar4 = (p->a).a.b.m_string.d.ptr;
    local_40 = (long)(p->a).a.b.m_offset;
    local_48 = lVar5;
    CVar3 = QtPrivate::QContainerImplHelper::mid((p->a).a.b.m_string.d.size,&local_40,&local_48);
    __src = (char16_t *)0x0;
    if (CVar3 != Null) {
      __src = pcVar4 + local_40;
    }
    memcpy(pQVar2 + lVar1,__src,lVar5 * 2);
    *out = *out + lVar5;
  }
  QVar6.m_data = *(p->a).b;
  QVar6.m_size = 6;
  QAbstractConcatenable::convertFromUtf8(QVar6,out);
  lVar1 = (p->b->d).size;
  if (lVar1 != 0) {
    pcVar4 = (p->b->d).ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar4,lVar1 * 2);
  }
  *out = *out + lVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }